

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-cardinalities.cc
# Opt level: O2

void __thiscall
testing::anon_unknown_6::BetweenCardinalityImpl::DescribeTo
          (BetweenCardinalityImpl *this,ostream *os)

{
  uint uVar1;
  ostream *poVar2;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar3;
  char *pcVar4;
  string local_30;
  
  iVar3 = this->max_;
  if (this->min_ != 0) {
    if (this->min_ == iVar3) {
      pcVar4 = "called ";
    }
    else {
      if (iVar3 != 0x7fffffff) {
        poVar2 = std::operator<<(os,"called between ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->min_);
        poVar2 = std::operator<<(poVar2," and ");
        os = (ostream *)std::ostream::operator<<(poVar2,this->max_);
        pcVar4 = " times";
        goto LAB_00191300;
      }
      pcVar4 = "called at least ";
    }
    poVar2 = std::operator<<(os,pcVar4);
    uVar1 = this->min_;
    iVar3 = extraout_EDX;
LAB_00191324:
    (anonymous_namespace)::FormatTimes_abi_cxx11_
              (&local_30,(_anonymous_namespace_ *)(ulong)uVar1,iVar3);
    std::operator<<(poVar2,(string *)&local_30);
    std::__cxx11::string::_M_dispose();
    return;
  }
  if (iVar3 == 0x7fffffff) {
    pcVar4 = "called any number of times";
  }
  else {
    if (iVar3 != 0) {
      poVar2 = std::operator<<(os,"called at most ");
      uVar1 = this->max_;
      iVar3 = extraout_EDX_00;
      goto LAB_00191324;
    }
    pcVar4 = "never called";
  }
LAB_00191300:
  std::operator<<(os,pcVar4);
  return;
}

Assistant:

void BetweenCardinalityImpl::DescribeTo(::std::ostream* os) const {
  if (min_ == 0) {
    if (max_ == 0) {
      *os << "never called";
    } else if (max_ == INT_MAX) {
      *os << "called any number of times";
    } else {
      *os << "called at most " << FormatTimes(max_);
    }
  } else if (min_ == max_) {
    *os << "called " << FormatTimes(min_);
  } else if (max_ == INT_MAX) {
    *os << "called at least " << FormatTimes(min_);
  } else {
    // 0 < min_ < max_ < INT_MAX
    *os << "called between " << min_ << " and " << max_ << " times";
  }
}